

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall backward::Printer::Printer(Printer *this)

{
  this->snippet = true;
  this->color_mode = automatic;
  this->address = false;
  this->object = false;
  this->inliner_context_size = 5;
  this->trace_context_size = 7;
  TraceResolver::TraceResolver(&this->_resolver);
  (this->_snippets)._src_files._M_h._M_buckets = &(this->_snippets)._src_files._M_h._M_single_bucket
  ;
  (this->_snippets)._src_files._M_h._M_bucket_count = 1;
  (this->_snippets)._src_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_snippets)._src_files._M_h._M_element_count = 0;
  (this->_snippets)._src_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_snippets)._src_files._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_snippets)._src_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Printer()
      : snippet(true), color_mode(ColorMode::automatic), address(false),
        object(false), inliner_context_size(5), trace_context_size(7) {}